

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O3

Result __thiscall MemTable::skipSearch(MemTable *this,LevelIter level,longlong key)

{
  _List_node_base *p_Var1;
  undefined1 auVar2 [16];
  QuadListNode<SSTableDataEntry> *pQVar3;
  QuadListNode<SSTableDataEntry> *pQVar4;
  Result RVar5;
  
  pQVar3 = (QuadListNode<SSTableDataEntry> *)level._M_node[1]._M_prev;
  pQVar4 = pQVar3->succ;
  p_Var1 = (this->qlist).
           super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  do {
    if ((pQVar4 != (QuadListNode<SSTableDataEntry> *)0x0) && (pQVar3 != pQVar4)) {
      do {
        if ((((QuadListNode<SSTableDataEntry> *)level._M_node[2]._M_next == pQVar4) ||
            (key < (pQVar4->data).key)) ||
           (pQVar4 = pQVar4->succ, pQVar4 == (QuadListNode<SSTableDataEntry> *)0x0)) break;
      } while (pQVar3 != pQVar4);
    }
    pQVar4 = pQVar4->pred;
    if ((((pQVar4->data).key == key) && (pQVar3 != pQVar4)) &&
       ((QuadListNode<SSTableDataEntry> *)level._M_node[2]._M_next != pQVar4)) {
      do {
        pQVar3 = pQVar4;
        pQVar4 = pQVar3->below;
      } while (pQVar4 != (QuadListNode<SSTableDataEntry> *)0x0);
      RVar5._1_7_ = (undefined7)((ulong)p_Var1 >> 8);
      RVar5.valid = true;
      RVar5.node = pQVar3;
      return RVar5;
    }
    if (level._M_node == p_Var1) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pQVar4;
      return (Result)(auVar2 << 0x40);
    }
    level._M_node = (level._M_node)->_M_next;
    pQVar4 = pQVar4->below;
    pQVar3 = (QuadListNode<SSTableDataEntry> *)level._M_node[1]._M_prev;
    if (pQVar4 == (QuadListNode<SSTableDataEntry> *)0x0) {
      pQVar4 = pQVar3->succ;
    }
  } while( true );
}

Assistant:

auto MemTable::skipSearch(MemTable::LevelIter level, long long key) {
    struct Result {
        bool valid;
        decltype(level->first()->succ) node;
    };
    auto *curr_node = level->first()->succ;
    auto result = Result{false, nullptr};
    while (true) {
        while (level->valid(curr_node) && curr_node->data.key <= key)
            curr_node = curr_node->succ;
        curr_node = curr_node->pred;
        result.node = curr_node;
        if (curr_node->data.key == key && level->valid(curr_node)) {
            result.valid = true;
            while (result.node->below) {
                result.node = result.node->below;
                // If k found, move to the bottom of its tower for better removing.
                // Though it has been marked as deleted, it should be return for further use like put.
                // This loop unable to process curr_node is header or trailer of level.
            }
            /*if (!level->valid(curr_node)) {
                if (curr_node == level->first()) {
                    result.node = qlist.rbegin()->first();
                }
                if (curr_node == level->last()) {
                    result.node = qlist.rbegin()->last();
                }
            }*/
            return result;
        }
        auto r = --qlist.rbegin().base();
        if (level == r) break;
        level++;
        if (curr_node->below) { // header and trailer node of a QuadList has no above or below. Their tower can be formed by qlist.
            curr_node = curr_node->below;
        } else {
            curr_node = level->first()->succ;
        }
    }

    return result;
}